

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

void putcontig8bitYCbCr12tile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  uchar *puVar1;
  uint32_t *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint32_t b;
  uint32_t local_84;
  uint32_t local_80;
  uint local_7c;
  uint32_t *local_78;
  uchar *local_70;
  TIFFRGBAImage *local_68;
  uint32_t local_5c;
  uint local_58;
  uint local_54;
  ulong local_50;
  long local_48;
  long local_40;
  uint32_t *local_38;
  
  local_50 = (ulong)w;
  local_68 = img;
  if (1 < h) {
    puVar2 = cp + local_50 + (long)toskew;
    local_40 = (long)(int)(w + toskew * 2) * -4;
    local_48 = -(long)(fromskew << 2);
    do {
      lVar3 = 0;
      lVar4 = local_48;
      lVar5 = local_40;
      local_78 = cp;
      local_70 = pp;
      local_5c = h;
      local_38 = puVar2;
      do {
        puVar1 = local_70;
        local_54 = (uint)local_70[lVar3 * 4 + 2];
        local_58 = (uint)local_70[lVar3 * 4 + 3];
        TIFFYCbCrtoRGB(local_68->ycbcr,(uint)local_70[lVar3 * 4],local_54,local_58,&local_7c,
                       &local_80,&local_84);
        local_78[lVar3] = local_84 << 0x10 | 0xff000000 | local_80 << 8 | local_7c;
        TIFFYCbCrtoRGB(local_68->ycbcr,(uint)puVar1[lVar3 * 4 + 1],local_54,local_58,&local_7c,
                       &local_80,&local_84);
        local_38[lVar3] = local_84 << 0x10 | 0xff000000 | local_80 << 8 | local_7c;
        lVar5 = lVar5 + -4;
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + -4;
      } while ((int)local_50 != (int)lVar3);
      cp = (uint32_t *)((long)local_78 - lVar5);
      puVar2 = (uint32_t *)((long)local_38 - lVar5);
      pp = local_70 + -lVar4;
      h = local_5c - 2;
    } while (1 < h);
    pp = local_70 + -lVar4;
    cp = (uint32_t *)((long)local_78 - lVar5);
  }
  if (h != 0) {
    lVar4 = 0;
    do {
      TIFFYCbCrtoRGB(local_68->ycbcr,(uint)pp[lVar4 * 4],(uint)pp[lVar4 * 4 + 2],
                     (uint)pp[lVar4 * 4 + 3],&local_7c,&local_80,&local_84);
      cp[lVar4] = local_80 << 8 | local_7c | local_84 << 0x10 | 0xff000000;
      lVar4 = lVar4 + 1;
    } while ((int)local_50 != (int)lVar4);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putcontig8bitYCbCr12tile)
{
    uint32_t *cp2;
    int32_t incr = 2 * toskew + w;
    (void)y;
    fromskew = (fromskew / 1) * (1 * 2 + 2);
    cp2 = cp + w + toskew;
    while (h >= 2)
    {
        x = w;
        do
        {
            uint32_t Cb = pp[2];
            uint32_t Cr = pp[3];
            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp2[0], pp[1]);
            cp++;
            cp2++;
            pp += 4;
        } while (--x);
        cp += incr;
        cp2 += incr;
        pp += fromskew;
        h -= 2;
    }
    if (h == 1)
    {
        x = w;
        do
        {
            uint32_t Cb = pp[2];
            uint32_t Cr = pp[3];
            YCbCrtoRGB(cp[0], pp[0]);
            cp++;
            pp += 4;
        } while (--x);
    }
}